

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O0

void CB_EXPLORE_ADF::predict_or_learn_regcb<false>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  reference ppeVar1;
  polyprediction *this;
  size_t sVar2;
  reference pvVar3;
  action_score *paVar4;
  vector<float,_std::allocator<float>_> *this_00;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  long in_RDI;
  undefined1 unaff_retaddr;
  multi_ex *in_stack_00000008;
  multi_learner *in_stack_00000010;
  cb_explore_adf *in_stack_00000018;
  float in_stack_00000024;
  vector<float,_std::allocator<float>_> *in_stack_00000028;
  vector<float,_std::allocator<float>_> *in_stack_00000030;
  size_t i_1;
  size_t a_1;
  float min_max_cost;
  size_t i;
  size_t a;
  size_t a_opt;
  float min_cost;
  float delta;
  float max_range;
  uint32_t num_actions;
  v_array<ACTION_SCORE::action_score> *preds;
  action_scores *in_stack_ffffffffffffff58;
  float local_84;
  score_iterator *in_stack_ffffffffffffff80;
  score_iterator *in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff93;
  float in_stack_ffffffffffffff94;
  ulong local_60;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  value_type vVar5;
  multi_ex *in_stack_ffffffffffffffb8;
  ulong i_00;
  multi_learner *in_stack_ffffffffffffffc0;
  ulong uVar6;
  ulong local_38;
  float local_30;
  
  LEARNER::multiline_learn_or_predict<false>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  ppeVar1 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDX,0);
  this = &(*ppeVar1)->pred;
  sVar2 = v_array<ACTION_SCORE::action_score>::size
                    ((v_array<ACTION_SCORE::action_score> *)&this->scalars);
  *(long *)(in_RDI + 0xa0) = *(long *)(in_RDI + 0xa0) + 1;
  local_84 = (float)((sVar2 & 0xffffffff) * *(long *)(in_RDI + 0xa0));
  std::log((double)(ulong)(uint)local_84);
  std::pow<float,int>(0.0,0x3566c5);
  get_cost_ranges(in_stack_00000030,in_stack_00000028,in_stack_00000024,in_stack_00000018,
                  in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr);
  if ((*(byte *)(in_RDI + 0x92) & 1) == 0) {
    vVar5 = 3.4028235e+38;
    for (uVar6 = 0; uVar6 < (sVar2 & 0xffffffff); uVar6 = uVar6 + 1) {
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x208),uVar6);
      if (*pvVar3 < vVar5) {
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x208),uVar6);
        vVar5 = *pvVar3;
      }
    }
    for (local_60 = 0;
        sVar2 = v_array<ACTION_SCORE::action_score>::size
                          ((v_array<ACTION_SCORE::action_score> *)&this->scalars), local_60 < sVar2;
        local_60 = local_60 + 1) {
      paVar4 = v_array<ACTION_SCORE::action_score>::operator[]
                         ((v_array<ACTION_SCORE::action_score> *)&this->scalars,local_60);
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x1f0),
                          (ulong)paVar4->action);
      if (vVar5 < *pvVar3) {
        paVar4 = v_array<ACTION_SCORE::action_score>::operator[]
                           ((v_array<ACTION_SCORE::action_score> *)&this->scalars,local_60);
        paVar4->score = 0.0;
      }
      else {
        paVar4 = v_array<ACTION_SCORE::action_score>::operator[]
                           ((v_array<ACTION_SCORE::action_score> *)&this->scalars,local_60);
        paVar4->score = 1.0;
      }
      ACTION_SCORE::begin_scores(in_stack_ffffffffffffff58);
      ACTION_SCORE::end_scores(in_stack_ffffffffffffff58);
      exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
                (in_stack_ffffffffffffff94,(bool)in_stack_ffffffffffffff93,in_stack_ffffffffffffff88
                 ,in_stack_ffffffffffffff80);
    }
  }
  else {
    local_30 = 3.4028235e+38;
    local_38 = 0;
    for (uVar6 = 0; uVar6 < (sVar2 & 0xffffffff); uVar6 = uVar6 + 1) {
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x1f0),uVar6);
      if (*pvVar3 < local_30) {
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x1f0),uVar6);
        local_30 = *pvVar3;
        local_38 = uVar6;
      }
    }
    uVar6 = 0;
    while (i_00 = uVar6,
          sVar2 = v_array<ACTION_SCORE::action_score>::size
                            ((v_array<ACTION_SCORE::action_score> *)&this->scalars), uVar6 < sVar2)
    {
      paVar4 = v_array<ACTION_SCORE::action_score>::operator[]
                         ((v_array<ACTION_SCORE::action_score> *)&this->scalars,i_00);
      if (paVar4->action == local_38) {
LAB_00356899:
        paVar4 = v_array<ACTION_SCORE::action_score>::operator[]
                           ((v_array<ACTION_SCORE::action_score> *)&this->scalars,i_00);
        paVar4->score = 1.0;
      }
      else {
        if ((*(byte *)(in_RDI + 0x91) & 1) == 0) {
          this_00 = (vector<float,_std::allocator<float>_> *)(in_RDI + 0x1f0);
          paVar4 = v_array<ACTION_SCORE::action_score>::operator[]
                             ((v_array<ACTION_SCORE::action_score> *)&this->scalars,i_00);
          pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                             (this_00,(ulong)paVar4->action);
          if ((*pvVar3 == local_30) && (!NAN(*pvVar3) && !NAN(local_30))) goto LAB_00356899;
        }
        paVar4 = v_array<ACTION_SCORE::action_score>::operator[]
                           ((v_array<ACTION_SCORE::action_score> *)&this->scalars,i_00);
        paVar4->score = 0.0;
      }
      uVar6 = i_00 + 1;
    }
  }
  return;
}

Assistant:

void predict_or_learn_regcb(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  if (is_learn && test_adf_sequence(examples) != nullptr)
  {
    for (size_t i = 0; i < examples.size() - 1; ++i)
    {
      CB::label& ld = examples[i]->l.cb;
      if (ld.costs.size() == 1)
        ld.costs[0].probability = 1.f;  // no importance weighting
    }

    multiline_learn_or_predict<true>(base, examples, data.offset);
  }
  else
    multiline_learn_or_predict<false>(base, examples, data.offset);

  v_array<action_score>& preds = examples[0]->pred.a_s;
  uint32_t num_actions = (uint32_t)preds.size();
  ++data.counter;

  const float max_range = data.max_cb_cost - data.min_cb_cost;
  // threshold on empirical loss difference
  const float delta = data.c0 * log((float)(num_actions * data.counter)) * pow(max_range, 2);

  if (!is_learn)
  {
    get_cost_ranges(data.min_costs, data.max_costs, delta, data, base, examples,
        /*min_only=*/data.regcbopt);

    if (data.regcbopt)  // optimistic variant
    {
      float min_cost = FLT_MAX;
      size_t a_opt = 0;  // optimistic action
      for (size_t a = 0; a < num_actions; ++a)
      {
        if (data.min_costs[a] < min_cost)
        {
          min_cost = data.min_costs[a];
          a_opt = a;
        }
      }
      for (size_t i = 0; i < preds.size(); ++i)
      {
        if (preds[i].action == a_opt || (!data.first_only && data.min_costs[preds[i].action] == min_cost))
          preds[i].score = 1;
        else
          preds[i].score = 0;
      }
    }
    else  // elimination variant
    {
      float min_max_cost = FLT_MAX;
      for (size_t a = 0; a < num_actions; ++a)
        if (data.max_costs[a] < min_max_cost)
          min_max_cost = data.max_costs[a];
      for (size_t i = 0; i < preds.size(); ++i)
      {
        if (data.min_costs[preds[i].action] <= min_max_cost)
          preds[i].score = 1;
        else
          preds[i].score = 0;
        // explore uniformly on support
        enforce_minimum_probability(1.0, /*update_zero_elements=*/false, begin_scores(preds), end_scores(preds));
      }
    }
  }
}